

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_fourier.cc
# Opt level: O1

int webrtc::RealFourier::FftOrder(size_t length)

{
  int iVar1;
  string *result;
  int iVar2;
  uint uVar3;
  uint uVar4;
  unsigned_long in_RDI;
  unsigned_long local_188;
  FatalMessage local_180;
  
  local_180.stream_ = (ostringstream)0x0;
  local_180._1_3_ = 0;
  local_188 = in_RDI;
  if (in_RDI == 0) {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_int>
                       (&local_188,(uint *)&local_180,"length > 0U");
  }
  else {
    result = (string *)0x0;
  }
  if (result == (string *)0x0) {
    uVar3 = (int)local_188 - 1;
    iVar2 = (uint)(0xffff < uVar3) * 0x10;
    iVar1 = iVar2 + 8;
    if ((uVar3 >> (sbyte)iVar2 & 0xff00) == 0) {
      iVar1 = iVar2;
    }
    iVar2 = iVar1 + 4;
    if ((uVar3 >> ((byte)iVar1 & 0x1f) & 0xf0) == 0) {
      iVar2 = iVar1;
    }
    iVar1 = iVar2 + 2;
    if ((uVar3 >> ((byte)iVar2 & 0x1f) & 0xc) == 0) {
      iVar1 = iVar2;
    }
    uVar4 = (uVar3 >> ((byte)iVar1 & 0x1f) & 2) >> 1;
    return (int)(ushort)((short)uVar4 + (short)iVar1 +
                        (ushort)((uVar3 >> (uVar4 + iVar1 & 0x1f) & 1) != 0));
  }
  rtc::FatalMessage::FatalMessage
            (&local_180,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/real_fourier.cc"
             ,0x21,result);
  rtc::FatalMessage::~FatalMessage(&local_180);
}

Assistant:

int RealFourier::FftOrder(size_t length) {
  RTC_CHECK_GT(length, 0U);
  return WebRtcSpl_GetSizeInBits(static_cast<uint32_t>(length - 1));
}